

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O2

bool __thiscall
CRollingBloomFilter::contains(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  int iVar1;
  long lVar2;
  pointer puVar3;
  uint uVar4;
  uint32_t uVar5;
  uint nHashNum;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  do {
    nHashNum = uVar4;
    iVar1 = this->nHashFuncs;
    if (iVar1 <= (int)nHashNum) break;
    uVar5 = RollingBloomHash(nHashNum,this->nTweak,vKey);
    puVar3 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = ((ulong)((long)(this->data).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar3) >> 3 & 0xffffffff) *
            (ulong)uVar5 >> 0x1d;
    uVar4 = nHashNum + 1;
  } while (((*(ulong *)((long)puVar3 + (uVar6 & 0xfffffffffffffff8 | 8)) |
            *(ulong *)((long)puVar3 + (uVar6 & 0xfffffffffffffff0))) >> ((ulong)uVar5 & 0x3f) & 1)
           != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar1 <= (int)nHashNum;
  }
  __stack_chk_fail();
}

Assistant:

bool CRollingBloomFilter::contains(Span<const unsigned char> vKey) const
{
    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        uint32_t pos = FastRange32(h, data.size());
        /* If the relevant bit is not set in either data[pos & ~1] or data[pos | 1], the filter does not contain vKey */
        if (!(((data[pos & ~1U] | data[pos | 1]) >> bit) & 1)) {
            return false;
        }
    }
    return true;
}